

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

string * __thiscall Parser::parse_word_abi_cxx11_(string *__return_storage_ptr__,Parser *this)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  uint uVar4;
  pointer pTVar5;
  bool detected_word_end;
  allocator<char> local_1a;
  undefined1 local_19;
  Parser *local_18;
  Parser *this_local;
  string *current_string;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Parser *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                     (&this->m_text_provider);
  TextProvider::get_current_char(pTVar5);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  bVar1 = 0;
  while( true ) {
    pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                       (&this->m_text_provider);
    uVar4 = (*pTVar5->_vptr_TextProvider[2])();
    bVar2 = false;
    if ((uVar4 & 1) != 0) {
      bVar2 = (bool)(bVar1 ^ 1);
    }
    if (!bVar2) break;
    pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                       (&this->m_text_provider);
    (*pTVar5->_vptr_TextProvider[3])();
    bVar2 = try_parse_return(this,false);
    if (bVar2) {
      bVar1 = 1;
      pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                         (&this->m_text_provider);
      (*pTVar5->_vptr_TextProvider[4])();
    }
    else {
      pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                         (&this->m_text_provider);
      cVar3 = TextProvider::get_current_char(pTVar5);
      if ((((cVar3 == ' ') || (cVar3 == '(')) || (cVar3 == ',')) ||
         (((cVar3 == '=' || (cVar3 == '[')) || ((cVar3 == ']' || (cVar3 == '|')))))) {
        bVar1 = 1;
        pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                           (&this->m_text_provider);
        (*pTVar5->_vptr_TextProvider[4])();
      }
      else {
        pTVar5 = std::unique_ptr<TextProvider,_std::default_delete<TextProvider>_>::operator->
                           (&this->m_text_provider);
        TextProvider::get_current_char(pTVar5);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Parser::parse_word()
{
	string current_string = "";
	current_string.push_back(m_text_provider->get_current_char());

	bool detected_word_end = false;
	while(m_text_provider->is_valid() && !detected_word_end)
	{
		m_text_provider->advance();
		if(try_parse_return(false))
		{
			detected_word_end = true;
			m_text_provider->reverse();
		}
		else
		{
			switch(m_text_provider->get_current_char())
			{
				case '=':
				case ',':
				case '(':
				case '[':
				case ']':
				case '|':
				case ' ':
					detected_word_end = true;
					m_text_provider->reverse();
				break;

				default:
					current_string.push_back(m_text_provider->get_current_char());
				break;
			}
		}
	}

	return current_string;
}